

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O1

void __thiscall OpenMD::CubicSpline::generate(CubicSpline *this)

{
  vector<double,_std::allocator<double>_> *v;
  pointer pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  pointer pdVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  CubicSpline *pCVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  vector<int,_std::allocator<int>_> p;
  undefined1 local_50 [40];
  pointer local_28;
  
  iVar7 = (int)((ulong)((long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  this->n = iVar7;
  std::vector<double,_std::allocator<double>_>::resize(&this->b,(long)iVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->c,(long)this->n);
  std::vector<double,_std::allocator<double>_>::resize(&this->d,(long)this->n);
  if (1 < (long)this->n) {
    v = &this->x_;
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar8 = true;
    pCVar10 = (CubicSpline *)0x1;
    do {
      if (pdVar1[(long)pCVar10] -
          pdVar1[(long)((long)&pCVar10[-1].d.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl + 0x17)] <= 0.0) {
        bVar8 = false;
      }
      pCVar10 = (CubicSpline *)((long)&pCVar10->_vptr_CubicSpline + 1);
    } while ((CubicSpline *)(long)this->n != pCVar10);
    if (!bVar8) {
      sort_permutation((vector<int,_std::allocator<int>_> *)(local_50 + 0x18),pCVar10,v);
      apply_permutation((vector<double,_std::allocator<double>_> *)local_50,pCVar10,v,
                        (vector<int,_std::allocator<int>_> *)(local_50 + 0x18));
      pCVar10 = (CubicSpline *)local_50;
      std::vector<double,_std::allocator<double>_>::_M_move_assign(v);
      if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) {
        pCVar10 = (CubicSpline *)(local_50._16_8_ - local_50._0_8_);
        operator_delete((void *)local_50._0_8_,(ulong)pCVar10);
      }
      apply_permutation((vector<double,_std::allocator<double>_> *)local_50,pCVar10,&this->y_,
                        (vector<int,_std::allocator<int>_> *)(local_50 + 0x18));
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->y_,local_50);
      if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ - local_50._0_8_);
      }
      if ((void *)local_50._24_8_ != (void *)0x0) {
        operator_delete((void *)local_50._24_8_,(long)local_28 - local_50._24_8_);
      }
    }
  }
  pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar15 = pdVar2[1];
  dVar17 = *pdVar2;
  *pdVar3 = dVar15 - dVar17;
  pdVar4 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar5 = (pdVar4[1] - *pdVar4) / (dVar15 - dVar17);
  iVar7 = this->n;
  lVar9 = (long)iVar7;
  if (lVar9 == 2) {
    *pdVar3 = 0.0;
    dVar15 = (pdVar4[1] - *pdVar4) / (pdVar2[1] - *pdVar2);
    *(this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar15 * dVar15 * -3.0;
    pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar15 = pow((pdVar3[1] - *pdVar3) / (pdVar2[1] - *pdVar2),3.0);
    pdVar1 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar1 = dVar15 * -2.0;
    pdVar6 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6[1] = *pdVar6;
    (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    pdVar1[1] = 0.0;
    pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->dx = 1.0 / (pdVar2[1] - *pdVar2);
    this->isUniform = true;
  }
  else {
    pdVar1 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar1 = *pdVar3 + *pdVar3;
    uVar11 = iVar7 - 1;
    if (2 < iVar7) {
      lVar14 = 0;
      do {
        dVar15 = *(double *)((long)pdVar2 + lVar14 + 0x10) - *(double *)((long)pdVar2 + lVar14 + 8);
        *(double *)((long)pdVar3 + lVar14 + 8) = dVar15;
        if (1e-05 < ABS(dVar15 - *pdVar3) / *pdVar3) {
          this->isUniform = false;
        }
        *(double *)((long)pdVar5 + lVar14 + 8) =
             (*(double *)((long)pdVar4 + lVar14 + 0x10) - *(double *)((long)pdVar4 + lVar14 + 8)) /
             dVar15;
        dVar15 = *(double *)((long)pdVar3 + lVar14 + 8) + *(double *)((long)pdVar3 + lVar14);
        *(double *)((long)pdVar1 + lVar14 + 8) = dVar15 + dVar15;
        lVar14 = lVar14 + 8;
      } while ((ulong)uVar11 * 8 + -8 != lVar14);
    }
    pdVar1[(int)uVar11] = pdVar3[lVar9 + -2] + pdVar3[lVar9 + -2];
    dVar15 = *pdVar5;
    dVar17 = pdVar5[1];
    dVar18 = *pdVar3;
    dVar19 = dVar18 + pdVar3[1];
    dVar16 = dVar15 - ((dVar17 - dVar15) * dVar18) / dVar19;
    if (3 < iVar7) {
      dVar16 = dVar16 + (dVar18 * (dVar15 + ((dVar19 * (pdVar5[2] - dVar17)) /
                                             (pdVar3[1] + pdVar3[2]) - dVar17))) /
                        (pdVar2[3] - *pdVar2);
    }
    dVar15 = pdVar5[lVar9 + -2];
    dVar18 = dVar15 - pdVar5[lVar9 + -3];
    dVar19 = pdVar3[lVar9 + -2] + pdVar3[lVar9 + -3];
    dVar17 = (pdVar3[lVar9 + -2] * dVar18) / dVar19 + dVar15;
    uVar12 = lVar9 - 2U & 0xffffffff;
    if (3 < iVar7) {
      dVar17 = dVar17 + ((dVar18 - (dVar19 * (pdVar5[lVar9 + -3] - pdVar5[lVar9 + -4])) /
                                   (pdVar3[lVar9 + -3] + pdVar3[lVar9 + -4])) * pdVar3[uVar12]) /
                        (pdVar2[(int)uVar11] - pdVar2[lVar9 + -4]);
    }
    pdVar5[(int)uVar11] = (dVar17 - dVar15) * 3.0;
    if (2 < iVar7) {
      lVar14 = uVar12 + 1;
      do {
        pdVar5[lVar14 + -1] = (pdVar5[lVar14 + -1] - pdVar5[lVar14 + -2]) * 3.0;
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    *pdVar5 = (*pdVar5 - dVar16) * 3.0;
    if (1 < iVar7) {
      lVar14 = 0;
      do {
        dVar15 = -pdVar3[lVar14] / pdVar1[lVar14];
        pdVar1[lVar14 + 1] = pdVar3[lVar14] * dVar15 + pdVar1[lVar14 + 1];
        pdVar5[lVar14 + 1] = dVar15 * pdVar5[lVar14] + pdVar5[lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while (lVar9 + -1 != lVar14);
    }
    pdVar5[(int)uVar11] = pdVar5[(int)uVar11] / pdVar1[(int)uVar11];
    if (1 < iVar7) {
      dVar15 = pdVar5[uVar12 + 1];
      lVar14 = uVar12 + 1;
      do {
        dVar15 = (pdVar5[lVar14 + -1] - dVar15 * pdVar3[lVar14 + -1]) / pdVar1[lVar14 + -1];
        pdVar5[lVar14 + -1] = dVar15;
        lVar13 = lVar14 + -1;
        bVar8 = 0 < lVar14;
        lVar14 = lVar13;
      } while (lVar13 != 0 && bVar8);
    }
    dVar15 = 0.0;
    if (1 < iVar7) {
      uVar12 = 0;
      do {
        dVar15 = pdVar2[uVar12 + 1] - pdVar2[uVar12];
        dVar17 = (pdVar5[uVar12 + 1] - pdVar5[uVar12]) / (dVar15 * 3.0);
        pdVar1[uVar12] = dVar17;
        pdVar3[uVar12] =
             (pdVar4[uVar12 + 1] - pdVar4[uVar12]) / dVar15 -
             (dVar17 * dVar15 + pdVar5[uVar12]) * dVar15;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    pdVar3[(int)uVar11] =
         (pdVar5[lVar9 + -2] + pdVar5[lVar9 + -2] + dVar15 * 3.0 * pdVar1[lVar9 + -2]) * dVar15 +
         pdVar3[lVar9 + -2];
    if (this->isUniform != false) {
      this->dx = 1.0 / (pdVar2[1] - *pdVar2);
    }
  }
  this->generated = true;
  return;
}

Assistant:

void CubicSpline::generate() {
    // Calculate coefficients defining a smooth cubic interpolatory spline.
    //
    // class values constructed:
    //   n   = number of data_ points.
    //   x_  = vector of independent variable values
    //   y_  = vector of dependent variable values
    //   b   = vector of S'(x_[i]) values.
    //   c   = vector of S"(x_[i])/2 values.
    //   d   = vector of S'''(x_[i]+)/6 values (i < n).
    // Local variables:

    RealType fp1, fpn, p;
    RealType h(0.0);

    // make sure the sizes match

    n = x_.size();
    b.resize(n);
    c.resize(n);
    d.resize(n);

    // make sure we are monotonically increasing in x:

    bool sorted = true;

    for (int i = 1; i < n; i++) {
      if ((x_[i] - x_[i - 1]) <= 0.0) sorted = false;
    }

    // sort if necessary

    if (!sorted) {
      std::vector<int> p = sort_permutation(x_);
      x_                 = apply_permutation(x_, p);
      y_                 = apply_permutation(y_, p);
    }

    // Calculate coefficients for the tridiagonal system: store
    // sub-diagonal in B, diagonal in D, difference quotient in C.

    b[0] = x_[1] - x_[0];
    c[0] = (y_[1] - y_[0]) / b[0];

    if (n == 2) {
      // Assume the derivatives at both endpoints are zero. Another
      // assumption could be made to have a linear interpolant between
      // the two points.  In that case, the b coefficients below would be
      // (y_[1] - y_[0]) / (x_[1] - x_[0])
      // and the c and d coefficients would both be zero.
      b[0]      = 0.0;
      c[0]      = -3.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 2);
      d[0]      = -2.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 3);
      b[1]      = b[0];
      c[1]      = 0.0;
      d[1]      = 0.0;
      dx        = 1.0 / (x_[1] - x_[0]);
      isUniform = true;
      generated = true;
      return;
    }

    d[0] = 2.0 * b[0];

    for (int i = 1; i < n - 1; i++) {
      b[i] = x_[i + 1] - x_[i];
      if (fabs(b[i] - b[0]) / b[0] > 1.0e-5) isUniform = false;
      c[i] = (y_[i + 1] - y_[i]) / b[i];
      d[i] = 2.0 * (b[i] + b[i - 1]);
    }

    d[n - 1] = 2.0 * b[n - 2];

    // Calculate estimates for the end slopes using polynomials
    // that interpolate the data_ nearest the end.

    fp1 = c[0] - b[0] * (c[1] - c[0]) / (b[0] + b[1]);
    if (n > 3)
      fp1 = fp1 +
            b[0] *
                ((b[0] + b[1]) * (c[2] - c[1]) / (b[1] + b[2]) - c[1] + c[0]) /
                (x_[3] - x_[0]);

    fpn = c[n - 2] + b[n - 2] * (c[n - 2] - c[n - 3]) / (b[n - 3] + b[n - 2]);

    if (n > 3)
      fpn = fpn + b[n - 2] *
                      (c[n - 2] - c[n - 3] -
                       (b[n - 3] + b[n - 2]) * (c[n - 3] - c[n - 4]) /
                           (b[n - 3] + b[n - 4])) /
                      (x_[n - 1] - x_[n - 4]);

    // Calculate the right hand side and store it in C.

    c[n - 1] = 3.0 * (fpn - c[n - 2]);
    for (int i = n - 2; i > 0; i--)
      c[i] = 3.0 * (c[i] - c[i - 1]);
    c[0] = 3.0 * (c[0] - fp1);

    // Solve the tridiagonal system.

    for (int k = 1; k < n; k++) {
      p    = b[k - 1] / d[k - 1];
      d[k] = d[k] - p * b[k - 1];
      c[k] = c[k] - p * c[k - 1];
    }

    c[n - 1] = c[n - 1] / d[n - 1];

    for (int k = n - 2; k >= 0; k--)
      c[k] = (c[k] - b[k] * c[k + 1]) / d[k];

    // Calculate the coefficients defining the spline.

    for (int i = 0; i < n - 1; i++) {
      h    = x_[i + 1] - x_[i];
      d[i] = (c[i + 1] - c[i]) / (3.0 * h);
      b[i] = (y_[i + 1] - y_[i]) / h - h * (c[i] + h * d[i]);
    }

    b[n - 1] = b[n - 2] + h * (2.0 * c[n - 2] + h * 3.0 * d[n - 2]);

    if (isUniform) dx = 1.0 / (x_[1] - x_[0]);

    generated = true;
    return;
  }